

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tt2ps.cpp
# Opt level: O0

json ConvertApprox(json *glyph,json *glyf)

{
  primitive_iterator_t *ppVar1;
  Point b;
  Point a;
  Point b_00;
  Point a_00;
  Point b_01;
  Point a_01;
  Point b_02;
  Point a_02;
  Point p1;
  Point p1_00;
  bool bVar2;
  int iVar3;
  reference this;
  size_type sVar4;
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *other;
  reference pbVar5;
  const_reference pvVar6;
  json_value extraout_RDX;
  json jVar7;
  initializer_list_t init;
  Point PVar8;
  Point *local_4b8;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_478;
  double local_468;
  double dStack_460;
  double local_458;
  double dStack_450;
  double local_448;
  double local_440;
  double local_438;
  double local_430;
  Point local_428;
  double local_418;
  double dStack_410;
  double local_408;
  double dStack_400;
  double local_3f8;
  double local_3f0;
  double local_3e8;
  double dStack_3e0;
  Point local_3d8;
  Point local_3c8;
  double local_3b8;
  double dStack_3b0;
  double local_3a8;
  double dStack_3a0;
  double local_398;
  double local_390;
  double local_388;
  double dStack_380;
  Point local_378;
  double local_368;
  double dStack_360;
  double local_358;
  double dStack_350;
  double local_348;
  double local_340;
  double local_338;
  double local_330;
  Point local_328;
  Point local_318;
  Point local_308;
  double local_2f8;
  double dStack_2f0;
  Point local_2e8;
  Point local_2d8;
  Point local_2c8;
  double local_2b8;
  double dStack_2b0;
  Point local_2a8;
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_298;
  difference_type local_278;
  double dStack_270;
  Point local_268;
  Point local_258;
  double local_248;
  double local_240;
  double local_238;
  double local_230;
  Point local_228;
  Point local_218;
  int local_204;
  size_type sStack_200;
  int state;
  size_t cnt;
  undefined1 local_1d8 [8];
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  end;
  const_iterator beg;
  const_iterator q;
  Point p [6];
  initializer_list<nlohmann::detail::json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
  local_110;
  undefined1 local_100 [8];
  json cubicContour;
  json *contour;
  iterator __end1;
  iterator __begin1;
  value_type *__range1;
  key_type local_98;
  allocator<char> local_71;
  key_type local_70;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_40;
  json local_30;
  json *glyf_local;
  json *glyph_local;
  
  glyf_local = glyf;
  glyph_local = glyph;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(&local_40,glyf);
  Dereference(&local_30,&local_40);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::operator=(glyf,&local_30);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&local_30);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&local_40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"instructions",&local_71);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::erase(glyf,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"LTSH_yPel",(allocator<char> *)((long)&__range1 + 7));
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::erase(glyf,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
  this = nlohmann::
         basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
         ::operator[]<char_const>
                   ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                     *)glyf,"contours");
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::begin((iterator *)&__end1.m_it.primitive_iterator,this);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::end((iterator *)&contour,this);
  do {
    bVar2 = nlohmann::detail::
            iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::operator!=((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                          *)&__end1.m_it.primitive_iterator,
                         (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                          *)&contour);
    if (!bVar2) {
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::basic_json(glyph,glyf);
      jVar7.m_value.object = extraout_RDX.object;
      jVar7._0_8_ = glyph;
      return jVar7;
    }
    cubicContour.m_value.object =
         (object_t *)
         nlohmann::detail::
         iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
         ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                      *)&__end1.m_it.primitive_iterator);
    sVar4 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::size((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)cubicContour.m_value.object);
    if (1 < sVar4) {
      std::
      initializer_list<nlohmann::detail::json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
      ::initializer_list(&local_110);
      init._M_len = (size_type)local_110._M_array;
      init._M_array = (iterator)local_100;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::array(init);
      local_4b8 = (Point *)&q.m_it.primitive_iterator;
      do {
        Point::Point(local_4b8);
        local_4b8 = local_4b8 + 1;
      } while (local_4b8 != (Point *)&p[5].y);
      nlohmann::detail::
      iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
      ::iter_impl((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                   *)&beg.m_it.primitive_iterator);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::cbegin((const_iterator *)&end.m_it.primitive_iterator,
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)cubicContour.m_value.object);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::cend((const_iterator *)&cnt,
             (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              *)cubicContour.m_value.object);
      other = nlohmann::detail::
              iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              ::operator--((const_iterator *)&cnt);
      nlohmann::detail::
      iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
      ::iter_impl((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                   *)local_1d8,other);
      sStack_200 = nlohmann::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   ::size((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                           *)cubicContour.m_value.object);
      local_204 = 0;
      pbVar5 = nlohmann::detail::
               iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
               ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                            *)&end.m_it.primitive_iterator);
      pvVar6 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)pbVar5,"on");
      bVar2 = nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::operator_bool<bool,_0>(pvVar6);
      if (bVar2) {
        ppVar1 = &beg.m_it.primitive_iterator;
        nlohmann::detail::
        iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
        ::operator=((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                     *)ppVar1,
                    (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                     *)&end.m_it.primitive_iterator);
        pbVar5 = nlohmann::detail::
                 iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                              *)ppVar1);
        Point::Point(&local_218,pbVar5);
        q.m_it.primitive_iterator.m_it = (difference_type)local_218.x;
        p[0].x = local_218.y;
      }
      else {
        pbVar5 = nlohmann::detail::
                 iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                              *)local_1d8);
        pvVar6 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                             *)pbVar5,"on");
        bVar2 = nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                ::operator_bool<bool,_0>(pvVar6);
        if (bVar2) {
          ppVar1 = &beg.m_it.primitive_iterator;
          nlohmann::detail::
          iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator=((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                       *)ppVar1,
                      (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                       *)local_1d8);
          pbVar5 = nlohmann::detail::
                   iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                   ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                                *)ppVar1);
          Point::Point(&local_228,pbVar5);
          q.m_it.primitive_iterator.m_it = (difference_type)local_228.x;
          p[0].x = local_228.y;
        }
        else {
          ppVar1 = &end.m_it.primitive_iterator;
          nlohmann::detail::
          iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator=((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                       *)&beg.m_it.primitive_iterator,
                      (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                       *)ppVar1);
          sStack_200 = sStack_200 + 1;
          pbVar5 = nlohmann::detail::
                   iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                   ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                                *)ppVar1);
          Point::Point(&local_258,pbVar5);
          pbVar5 = nlohmann::detail::
                   iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                   ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                                *)local_1d8);
          Point::Point(&local_268,pbVar5);
          PVar8 = operator+(local_258,local_268);
          local_240 = PVar8.y;
          local_248 = PVar8.x;
          PVar8 = operator/(PVar8,2.0);
          local_230 = PVar8.y;
          local_238 = PVar8.x;
          q.m_it.primitive_iterator.m_it = (difference_type)local_238;
          p[0].x = local_230;
        }
      }
      local_278 = q.m_it.primitive_iterator.m_it;
      dStack_270 = p[0].x;
      PVar8.y = p[0].x;
      PVar8.x = (double)q.m_it.primitive_iterator.m_it;
      ConstructCffPath::Move((ConstructCffPath *)local_100,pbVar5,PVar8);
      while (sVar4 = sStack_200 - 1, sStack_200 != 0) {
        sStack_200 = sVar4;
        bVar2 = nlohmann::detail::
                iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                ::operator==((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                              *)&beg.m_it.primitive_iterator,
                             (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                              *)&end.m_it.primitive_iterator);
        if (bVar2) {
          nlohmann::detail::
          iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::iter_impl(&local_298,
                      (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                       *)local_1d8);
        }
        else {
          nlohmann::detail::
          iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator-(&local_298,
                      (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                       *)&beg.m_it.primitive_iterator,1);
        }
        ppVar1 = &beg.m_it.primitive_iterator;
        nlohmann::detail::
        iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
        ::operator=((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                     *)ppVar1,&local_298);
        pbVar5 = nlohmann::detail::
                 iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                              *)ppVar1);
        pvVar6 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                             *)pbVar5,"on");
        bVar2 = nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                ::operator_bool<bool,_0>(pvVar6);
        if (bVar2) {
          switch(local_204) {
          case 0:
            if (sStack_200 != 0) {
              pbVar5 = nlohmann::detail::
                       iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                       ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                                    *)&beg.m_it.primitive_iterator);
              Point::Point(&local_2a8,pbVar5);
              q.m_it.primitive_iterator.m_it = (difference_type)local_2a8.x;
              p[0].x = local_2a8.y;
              local_2b8 = local_2a8.x;
              dStack_2b0 = local_2a8.y;
              p1_00.y = local_2a8.y;
              p1_00.x = local_2a8.x;
              ConstructCffPath::Line((ConstructCffPath *)local_100,pbVar5,p1_00);
            }
            break;
          case 1:
            pbVar5 = nlohmann::detail::
                     iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                     ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                                  *)&beg.m_it.primitive_iterator);
            Point::Point(&local_2c8,pbVar5);
            p[1].y = local_2c8.x;
            p[2].x = local_2c8.y;
            local_204 = 3;
            break;
          case 2:
            pbVar5 = nlohmann::detail::
                     iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                     ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                                  *)&beg.m_it.primitive_iterator);
            Point::Point(&local_2d8,pbVar5);
            p[3].y = local_2d8.x;
            p[4].x = local_2d8.y;
            iVar3 = CombinePair((Point *)&q.m_it.primitive_iterator,(json *)local_100);
            local_204 = 3;
            if (iVar3 != 0) {
              local_204 = 0;
            }
            break;
          case 3:
            SimpleCurve((Point *)&q.m_it.primitive_iterator,(json *)local_100);
            if (sStack_200 != 0) {
              pbVar5 = nlohmann::detail::
                       iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                       ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                                    *)&beg.m_it.primitive_iterator);
              Point::Point(&local_2e8,pbVar5);
              q.m_it.primitive_iterator.m_it = (difference_type)local_2e8.x;
              p[0].x = local_2e8.y;
              local_2f8 = local_2e8.x;
              dStack_2f0 = local_2e8.y;
              p1.y = local_2e8.y;
              p1.x = local_2e8.x;
              ConstructCffPath::Line((ConstructCffPath *)local_100,pbVar5,p1);
            }
            local_204 = 0;
            break;
          case 4:
            pbVar5 = nlohmann::detail::
                     iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                     ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                                  *)&beg.m_it.primitive_iterator);
            Point::Point(&local_308,pbVar5);
            p[3].y = local_308.x;
            p[4].x = local_308.y;
            iVar3 = CombinePair((Point *)&q.m_it.primitive_iterator,(json *)local_100);
            local_204 = 3;
            if (iVar3 != 0) {
              local_204 = 0;
            }
          }
        }
        else {
          switch(local_204) {
          case 0:
            pbVar5 = nlohmann::detail::
                     iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                     ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                                  *)&beg.m_it.primitive_iterator);
            Point::Point(&local_318,pbVar5);
            p[0].y = local_318.x;
            p[1].x = local_318.y;
            local_204 = 1;
            break;
          case 1:
            pbVar5 = nlohmann::detail::
                     iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                     ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                                  *)&beg.m_it.primitive_iterator);
            Point::Point(&local_328,pbVar5);
            p[2].y = local_328.x;
            p[3].x = local_328.y;
            local_358 = p[0].y;
            dStack_350 = p[1].x;
            local_368 = local_328.x;
            dStack_360 = local_328.y;
            a_02.y = p[1].x;
            a_02.x = p[0].y;
            b_02.y = local_328.y;
            b_02.x = local_328.x;
            PVar8 = operator+(a_02,b_02);
            local_340 = PVar8.y;
            local_348 = PVar8.x;
            PVar8 = operator/(PVar8,2.0);
            local_330 = PVar8.y;
            local_338 = PVar8.x;
            local_204 = 2;
            p[1].y = local_338;
            p[2].x = local_330;
            break;
          case 2:
            pbVar5 = nlohmann::detail::
                     iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                     ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                                  *)&beg.m_it.primitive_iterator);
            Point::Point(&local_378,pbVar5);
            p[4].y = local_378.x;
            p[5].x = local_378.y;
            local_3a8 = p[2].y;
            dStack_3a0 = p[3].x;
            local_3b8 = local_378.x;
            dStack_3b0 = local_378.y;
            a_01.y = p[3].x;
            a_01.x = p[2].y;
            b_01.y = local_378.y;
            b_01.x = local_378.x;
            PVar8 = operator+(a_01,b_01);
            local_390 = PVar8.y;
            local_398 = PVar8.x;
            PVar8 = operator/(PVar8,2.0);
            dStack_380 = PVar8.y;
            local_388 = PVar8.x;
            p[3].y = local_388;
            p[4].x = dStack_380;
            iVar3 = CombinePair((Point *)&q.m_it.primitive_iterator,(json *)local_100);
            if (iVar3 == 0) {
              p[2].y = p[4].y;
              p[3].x = p[5].x;
              local_204 = 4;
            }
            else {
              p[0].y = p[4].y;
              p[1].x = p[5].x;
              local_204 = 1;
            }
            break;
          case 3:
            pbVar5 = nlohmann::detail::
                     iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                     ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                                  *)&beg.m_it.primitive_iterator);
            Point::Point(&local_3c8,pbVar5);
            p[2].y = local_3c8.x;
            p[3].x = local_3c8.y;
            local_204 = 4;
            break;
          case 4:
            pbVar5 = nlohmann::detail::
                     iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                     ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                                  *)&beg.m_it.primitive_iterator);
            Point::Point(&local_3d8,pbVar5);
            p[4].y = local_3d8.x;
            p[5].x = local_3d8.y;
            local_408 = p[2].y;
            dStack_400 = p[3].x;
            local_418 = local_3d8.x;
            dStack_410 = local_3d8.y;
            a_00.y = p[3].x;
            a_00.x = p[2].y;
            b_00.y = local_3d8.y;
            b_00.x = local_3d8.x;
            PVar8 = operator+(a_00,b_00);
            local_3f0 = PVar8.y;
            local_3f8 = PVar8.x;
            PVar8 = operator/(PVar8,2.0);
            dStack_3e0 = PVar8.y;
            local_3e8 = PVar8.x;
            p[3].y = local_3e8;
            p[4].x = dStack_3e0;
            iVar3 = CombinePair((Point *)&q.m_it.primitive_iterator,(json *)local_100);
            if (iVar3 == 0) {
              p[2].y = p[4].y;
              p[3].x = p[5].x;
              local_204 = 2;
            }
            else {
              p[0].y = p[4].y;
              p[1].x = p[5].x;
              local_204 = 1;
            }
          }
        }
      }
      if (local_204 == 2) {
        sStack_200 = sVar4;
        pbVar5 = nlohmann::detail::
                 iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                              *)&beg.m_it.primitive_iterator);
        Point::Point(&local_428,pbVar5);
        p[2].y = local_428.x;
        p[3].x = local_428.y;
        local_458 = p[0].y;
        dStack_450 = p[1].x;
        local_468 = local_428.x;
        dStack_460 = local_428.y;
        a.y = p[1].x;
        a.x = p[0].y;
        b.y = local_428.y;
        b.x = local_428.x;
        PVar8 = operator+(a,b);
        local_440 = PVar8.y;
        local_448 = PVar8.x;
        PVar8 = operator/(PVar8,2.0);
        local_430 = PVar8.y;
        local_438 = PVar8.x;
        p[1].y = local_438;
        p[2].x = local_430;
LAB_0012c009:
        SimpleCurve((Point *)&q.m_it.primitive_iterator,(json *)local_100);
      }
      else {
        sStack_200 = sVar4;
        if (local_204 - 3U < 2) goto LAB_0012c009;
      }
      ConstructCffPath::Finish((json *)local_100);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::basic_json(&local_478,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)local_100);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)cubicContour.m_value.object,&local_478);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json(&local_478);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)local_100);
    }
    nlohmann::detail::
    iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::operator++((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                  *)&__end1.m_it.primitive_iterator);
  } while( true );
}

Assistant:

static json ConvertApprox(json glyph, const json &glyf)
{
	glyph = Dereference(std::move(glyph), glyf);
	glyph.erase("instructions");
	glyph.erase("LTSH_yPel");

	for (json &contour : glyph["contours"])
	{
		if (contour.size() <= 1)
			continue;

		json cubicContour = json::array();
		Point p[6];             // points: 0,2,4-on, 1,3-off, 5-tmp
		json::const_iterator q; // current point
		auto beg = contour.cbegin();
		auto end = --contour.cend();
		size_t cnt = contour.size();
		int state = 0;

		// save initial on-curve point
		if ((*beg)["on"])
		{
			q = beg;
			p[0] = *q;
		}
		else if ((*end)["on"])
		{
			q = end;
			p[0] = *q;
		}
		else
		{
			// start at mid-point
			q = beg;
			cnt++;
			p[0] = (Point(*beg) + *end) / 2;
		}
		ConstructCffPath::Move(cubicContour, p[0]);

		while (cnt--)
		{
			// advance to next point, in reversed direction
			q = (q == beg) ? end : q - 1;

			if ((*q)["on"])
			{
				// on-curve
				switch (state)
				{
				case 0:
					if (cnt > 0)
					{
						p[0] = *q;
						ConstructCffPath::Line(cubicContour, p[0]);
						// stay in state 0
					}
					break;
				case 1:
					p[2] = *q;
					state = 3;
					break;
				case 2:
					p[4] = *q;
					state = CombinePair(p, cubicContour) ? 0 : 3;
					break;
				case 3:
					SimpleCurve(p, cubicContour);
					if (cnt > 0)
					{
						p[0] = *q;
						ConstructCffPath::Line(cubicContour, p[0]);
					}
					state = 0;
					break;
				case 4:
					p[4] = *q;
					state = CombinePair(p, cubicContour) ? 0 : 3;
					break;
				}
			}
			else
			{
				// off-curve
				switch (state)
				{
				case 0:
					p[1] = *q;
					state = 1;
					break;
				case 1:
					p[3] = *q;
					p[2] = (p[1] + p[3]) / 2;
					state = 2;
					break;
				case 2:
					p[5] = *q;
					p[4] = (p[3] + p[5]) / 2;
					if (CombinePair(p, cubicContour))
					{
						p[1] = p[5];
						state = 1;
					}
					else
					{
						p[3] = p[5];
						state = 4;
					}
					break;
				case 3:
					p[3] = *q;
					state = 4;
					break;
				case 4:
					p[5] = *q;
					p[4] = (p[3] + p[5]) / 2;
					if (CombinePair(p, cubicContour))
					{
						p[1] = p[5];
						state = 1;
					}
					else
					{
						p[3] = p[5];
						state = 2;
					}
					break;
				}
			}
		}

		// finish up
		switch (state)
		{
		case 2:
			p[3] = *q;
			p[2] = (p[1] + p[3]) / 2;
			[[fallthrough]];
		case 3:
		case 4:
			SimpleCurve(p, cubicContour);
			break;
		}

		ConstructCffPath::Finish(cubicContour);
		contour = cubicContour;
	}

	return glyph;
}